

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O0

Array * __thiscall FlatZinc::ParserState::getOutput(ParserState *this)

{
  bool bVar1;
  Array *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Array *in_RDI;
  Node **j;
  iterator __end4;
  iterator __begin4;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *__range4;
  Array *oa;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
  *i;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  *__range2;
  Array *a;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *in_stack_fffffffffffffed8;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *in_stack_fffffffffffffee0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>_>
  in_stack_fffffffffffffee8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>_>
  in_stack_fffffffffffffef0;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *this_00;
  undefined8 in_stack_ffffffffffffff08;
  int n;
  undefined1 local_d1 [33];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
  *local_b0;
  reference local_a8;
  Node **local_a0;
  __normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
  local_98;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *local_90;
  Array *local_88;
  undefined1 local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  reference local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
  *local_48;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>_>
  local_40;
  Array *local_38;
  Array *local_20;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
  *local_18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
  *local_10;
  
  n = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_10 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
                         *)in_stack_fffffffffffffed8);
  local_18 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
                       *)in_stack_fffffffffffffed8);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>*,std::vector<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>,std::allocator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>>>>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pAVar2 = (Array *)operator_new(0x20);
  AST::Array::Array(in_RDI,n);
  local_38 = in_RDI + 1;
  local_20 = pAVar2;
  local_40._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
                   *)in_stack_fffffffffffffed8);
  local_48 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
                       *)in_stack_fffffffffffffed8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>_>
                             *)in_stack_fffffffffffffee0,
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>_>
                             *)in_stack_fffffffffffffed8), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>_>
               ::operator*(&local_40);
    this_00 = &local_20->a;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x28);
    local_79 = 1;
    std::operator+(__lhs,(char *)this_00);
    AST::String::String((String *)in_stack_fffffffffffffef0._M_current,
                        &(in_stack_fffffffffffffee8._M_current)->first);
    local_79 = 0;
    local_58 = __lhs;
    std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::push_back
              (in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_78);
    bVar1 = AST::Node::isArray((Node *)in_stack_fffffffffffffee0);
    if (bVar1) {
      local_88 = AST::Node::getArray((Node *)this_00);
      local_90 = &local_88->a;
      local_98._M_current =
           (Node **)std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::
                    begin(in_stack_fffffffffffffed8);
      local_a0 = (Node **)std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                          ::end(in_stack_fffffffffffffed8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
                                 *)in_stack_fffffffffffffee0,
                                (__normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
                                 *)in_stack_fffffffffffffed8), bVar1) {
        local_a8 = __gnu_cxx::
                   __normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
                   ::operator*(&local_98);
        std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::push_back
                  ((vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *)
                   in_stack_fffffffffffffef0._M_current,
                   (value_type *)in_stack_fffffffffffffee8._M_current);
        *local_a8 = (Node *)0x0;
        __gnu_cxx::
        __normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
        ::operator++(&local_98);
      }
      if (local_50->second != (Node *)0x0) {
        (*local_50->second->_vptr_Node[1])();
      }
    }
    else {
      std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::push_back
                ((vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *)
                 in_stack_fffffffffffffef0._M_current,
                 (value_type *)in_stack_fffffffffffffee8._M_current);
    }
    in_stack_fffffffffffffee0 = &local_20->a;
    in_stack_fffffffffffffee8._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
          *)operator_new(0x28);
    in_stack_fffffffffffffef0._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>
          *)local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_d1 + 1),";\n",(allocator *)in_stack_fffffffffffffef0._M_current);
    AST::String::String((String *)in_stack_fffffffffffffef0._M_current,
                        &(in_stack_fffffffffffffee8._M_current)->first);
    local_b0 = in_stack_fffffffffffffee8._M_current;
    std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::push_back
              (in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)(local_d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>_>
    ::operator++(&local_40);
  }
  return local_20;
}

Assistant:

AST::Array* getOutput() {
		std::sort(_output.begin(), _output.end());
		auto* a = new AST::Array();
		for (auto& i : _output) {
			a->a.push_back(new AST::String(i.first + " = "));
			if (i.second->isArray()) {
				AST::Array* oa = i.second->getArray();
				for (auto& j : oa->a) {
					a->a.push_back(j);
					j = nullptr;
				}
				delete i.second;
			} else {
				a->a.push_back(i.second);
			}
			a->a.push_back(new AST::String(";\n"));
		}
		return a;
	}